

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

uint decodeUTF8(char **s)

{
  uint uVar1;
  uint local_18;
  int local_14;
  uint count;
  uint ch;
  char **s_local;
  
  local_14 = 0;
  local_18 = 0;
  uVar1 = local_18;
  do {
    local_18 = uVar1;
    local_14 = local_14 * 0x40 + (uint)(byte)**s;
    *s = *s + 1;
    uVar1 = local_18 + 1;
  } while (((int)**s & 0xc0U) == 0x80);
  if (local_18 + 1 < 7) {
    return local_14 - decodeUTF8::offsets[local_18];
  }
  __assert_fail("count <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/deps/glfw/src/x11_window.c"
                ,0x1e2,"unsigned int decodeUTF8(const char **)");
}

Assistant:

static unsigned int decodeUTF8(const char** s)
{
    unsigned int ch = 0, count = 0;
    static const unsigned int offsets[] =
    {
        0x00000000u, 0x00003080u, 0x000e2080u,
        0x03c82080u, 0xfa082080u, 0x82082080u
    };

    do
    {
        ch = (ch << 6) + (unsigned char) **s;
        (*s)++;
        count++;
    } while ((**s & 0xc0) == 0x80);

    assert(count <= 6);
    return ch - offsets[count - 1];
}